

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O2

void __thiscall
betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::finished
          (betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          bool with_cell_counts)

{
  ushort uVar1;
  ushort uVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> skipped;
  pointer puVar3;
  pointer puVar4;
  size_type __new_size;
  pointer puVar5;
  ulong uVar6;
  unsigned_long i;
  undefined7 in_register_00000031;
  long lVar7;
  long lVar8;
  undefined1 approximate_computation;
  undefined1 in_stack_ffffffffffffff58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> number_of_cells;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar5 = (this->complex->cell_count).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->complex->cell_count).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = ((long)puVar4 - (long)puVar5 >> 3) - 1;
  if (uVar6 < total_top_dimension) {
    uVar6 = total_top_dimension;
  }
  total_top_dimension = uVar6;
  if ((int)CONCAT71(in_register_00000031,with_cell_counts) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&total_cell_count,0);
    uVar6 = (long)(this->complex->cell_count).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->complex->cell_count).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  else {
    for (uVar6 = 0; __new_size = (long)puVar4 - (long)puVar5 >> 3, uVar6 <= __new_size - 1;
        uVar6 = uVar6 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&number_of_cells,(unsigned_long *)&stack0xffffffffffffff58);
      puVar5 = (this->complex->cell_count).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->complex->cell_count).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    in_stack_ffffffffffffff58 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&total_cell_count,__new_size,(value_type_conflict3 *)&stack0xffffffffffffff58);
    puVar4 = total_cell_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(this->complex->cell_count).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar5;
    lVar7 = 0;
    for (lVar8 = 0; (long)uVar6 >> 3 != lVar8; lVar8 = lVar8 + 1) {
      puVar4[lVar8] = puVar4[lVar8] + *(long *)((long)puVar5 + (lVar7 >> 0x1d));
      lVar7 = lVar7 + 0x100000000;
    }
  }
  uVar1 = this->min_dimension;
  uVar2 = this->max_dimension;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,&number_of_cells);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,&this->betti);
  approximate_computation = 0xfd;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&this->skipped);
  skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = this->approximate_computation;
  skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_48;
  skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = with_cell_counts;
  skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  print_ordinary((ostream *)
                 &(this->
                  super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                  ).outstream,(uint)uVar1,(uint)uVar2,(int)(uVar6 >> 3) + -1,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,skipped,
                 (bool)approximate_computation,(bool)in_stack_ffffffffffffff58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&total_betti,
             (long)(this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,
             (value_type_conflict3 *)&stack0xffffffffffffff58);
  puVar3 = total_betti.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar7 = 0; (long)puVar4 - (long)puVar5 >> 3 != lVar7; lVar7 = lVar7 + 1) {
    puVar3[lVar7] = puVar3[lVar7] + puVar5[lVar7];
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&total_skipped,
             (long)(this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,
             (value_type_conflict3 *)&stack0xffffffffffffff58);
  puVar3 = total_skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = (this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (lVar7 = 0; (long)puVar4 - (long)puVar5 >> 3 != lVar7; lVar7 = lVar7 + 1) {
    puVar3[lVar7] = puVar3[lVar7] + puVar5[lVar7];
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void betti_output_t<Complex>::finished(bool with_cell_counts) {
	std::vector<size_t> number_of_cells;
	total_top_dimension = std::max(total_top_dimension, complex->top_dimension());

	if (with_cell_counts) {
		for (auto i = 0ul; i <= complex->top_dimension(); i++) number_of_cells.push_back(complex->number_of_cells(i));

		total_cell_count.resize(complex->top_dimension() + 1, 0);
		for (auto i = 0ul; i <= complex->top_dimension(); i++) total_cell_count[i] += complex->number_of_cells(i);
	} else {
		total_cell_count.resize(0);
	}

	print_ordinary(file_output_t<Complex>::outstream, int(min_dimension), int(max_dimension),
	               int(complex->top_dimension()), number_of_cells, betti, skipped, approximate_computation,
	               with_cell_counts);

	total_betti.resize(betti.size(), 0);
	for (size_t idx = 0; idx < betti.size(); idx++) total_betti[idx] += betti[idx];

	total_skipped.resize(skipped.size(), 0);
	for (size_t idx = 0; idx < skipped.size(); idx++) total_skipped[idx] += skipped[idx];
}